

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O3

void printArithExtend(MCInst *MI,uint OpNum,SStream *O)

{
  uint16_t *puVar1;
  cs_detail *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  MCOperand *pMVar7;
  ulong uVar8;
  char *s;
  long lVar9;
  byte bVar10;
  
  pMVar7 = MCInst_getOperand(MI,OpNum);
  uVar8 = MCOperand_getImm(pMVar7);
  switch((uint)(uVar8 >> 3) & 7) {
  case 0:
    lVar9 = 5;
    break;
  case 1:
    lVar9 = 6;
    break;
  case 2:
    lVar9 = 7;
    bVar10 = 1;
    bVar3 = false;
    goto LAB_00209874;
  case 3:
    lVar9 = 8;
    bVar3 = true;
    bVar10 = 0;
LAB_00209874:
    pMVar7 = MCInst_getOperand(MI,0);
    uVar4 = MCOperand_getReg(pMVar7);
    pMVar7 = MCInst_getOperand(MI,1);
    uVar5 = MCOperand_getReg(pMVar7);
    if (((!bVar3) || (uVar4 != 4 && uVar5 != 4)) && (!(bool)(bVar10 & (uVar5 == 5 || uVar4 == 5))))
    break;
    if ((uVar8 & 7) == 0) {
      return;
    }
    s = ", lsl ";
    goto LAB_00209971;
  case 4:
    lVar9 = 9;
    break;
  case 5:
    lVar9 = 10;
    break;
  case 6:
    lVar9 = 0xb;
    break;
  case 7:
    lVar9 = 0xc;
  }
  SStream_concat(O,", %s",(long)&DAT_00376144 + (long)*(int *)(&UNK_00376130 + lVar9 * 4));
  if (MI->csh->detail != CS_OPT_OFF) {
    iVar6 = 1;
    if ((int)lVar9 - 6U < 7) {
      iVar6 = (int)lVar9 + -4;
    }
    pcVar2 = MI->flat_insn->detail;
    *(int *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + -0xf) = iVar6;
  }
  if ((uVar8 & 7) != 0) {
    s = " ";
LAB_00209971:
    uVar4 = (uint)uVar8 & 7;
    SStream_concat0(O,s);
    printInt32Bang(O,uVar4);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->regs_write + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x1c + 9;
      puVar1[0] = 1;
      puVar1[1] = 0;
      pcVar2 = MI->flat_insn->detail;
      *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + -0x13) = uVar4;
    }
  }
  return;
}

Assistant:

static void printArithExtend(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned Val = (unsigned)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	AArch64_AM_ShiftExtendType ExtType = AArch64_AM_getArithExtendType(Val);
	unsigned ShiftVal = AArch64_AM_getArithShiftValue(Val);

	// If the destination or first source register operand is [W]SP, print
	// UXTW/UXTX as LSL, and if the shift amount is also zero, print nothing at
	// all.
	if (ExtType == AArch64_AM_UXTW || ExtType == AArch64_AM_UXTX) {
		unsigned Dest = MCOperand_getReg(MCInst_getOperand(MI, 0));
		unsigned Src1 = MCOperand_getReg(MCInst_getOperand(MI, 1));
		if ( ((Dest == AArch64_SP || Src1 == AArch64_SP) &&
					ExtType == AArch64_AM_UXTX) ||
				((Dest == AArch64_WSP || Src1 == AArch64_WSP) &&
				 ExtType == AArch64_AM_UXTW) ) {
			if (ShiftVal != 0) {
				SStream_concat0(O, ", lsl ");
				printInt32Bang(O, ShiftVal);
				if (MI->csh->detail) {
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.type = ARM64_SFT_LSL;
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.value = ShiftVal;
				}
			}

			return;
		}
	}

	SStream_concat(O, ", %s", AArch64_AM_getShiftExtendName(ExtType));
	if (MI->csh->detail) {
		arm64_extender ext = ARM64_EXT_INVALID;
		switch(ExtType) {
			default:	// never reach
			case AArch64_AM_UXTB:
				ext = ARM64_EXT_UXTB;
				break;
			case AArch64_AM_UXTH:
				ext = ARM64_EXT_UXTH;
				break;
			case AArch64_AM_UXTW:
				ext = ARM64_EXT_UXTW;
				break;
			case AArch64_AM_UXTX:
				ext = ARM64_EXT_UXTX;
				break;
			case AArch64_AM_SXTB:
				ext = ARM64_EXT_SXTB;
				break;
			case AArch64_AM_SXTH:
				ext = ARM64_EXT_SXTH;
				break;
			case AArch64_AM_SXTW:
				ext = ARM64_EXT_SXTW;
				break;
			case AArch64_AM_SXTX:
				ext = ARM64_EXT_SXTX;
				break;
		}

		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].ext = ext;
	}

	if (ShiftVal != 0) {
		SStream_concat0(O, " ");
		printInt32Bang(O, ShiftVal);
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.type = ARM64_SFT_LSL;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count - 1].shift.value = ShiftVal;
		}
	}
}